

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPAddress.cpp
# Opt level: O0

unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> *
jaegertracing::net::resolveAddress
          (unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> *__return_storage_ptr__,
          string *host,int port,int family,int type)

{
  int __ecode;
  char *pcVar1;
  char *__service;
  ostream *poVar2;
  runtime_error *this;
  string local_250 [32];
  undefined1 local_230 [8];
  ostringstream oss;
  pointer paStack_b0;
  int returnCode;
  addrinfo *servInfoPtr;
  OSResource osResouce;
  string local_98;
  string local_78 [8];
  string service;
  addrinfo hints;
  int type_local;
  int family_local;
  int port_local;
  string *host_local;
  unique_ptr<addrinfo,_jaegertracing::net::AddrInfoDeleter> *servInfo;
  
  memset((void *)((long)&service.field_2 + 8),0,0x30);
  service.field_2._12_4_ = family;
  std::__cxx11::string::string(local_78);
  if (port != 0) {
    std::__cxx11::to_string(&local_98,port);
    std::__cxx11::string::operator=(local_78,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  Socket::OSResource::OSResource((OSResource *)((long)&servInfoPtr + 3));
  paStack_b0 = (pointer)0x0;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  __service = (char *)std::__cxx11::string::c_str();
  __ecode = getaddrinfo(pcVar1,__service,(addrinfo *)((long)&service.field_2 + 8),
                        (addrinfo **)&stack0xffffffffffffff50);
  std::unique_ptr<addrinfo,jaegertracing::net::AddrInfoDeleter>::
  unique_ptr<jaegertracing::net::AddrInfoDeleter,void>
            ((unique_ptr<addrinfo,jaegertracing::net::AddrInfoDeleter> *)__return_storage_ptr__,
             paStack_b0);
  if (__ecode == 0) {
    Socket::OSResource::~OSResource((OSResource *)((long)&servInfoPtr + 3));
    std::__cxx11::string::~string(local_78);
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_230);
  poVar2 = std::operator<<((ostream *)local_230,"Error resolving address: ");
  pcVar1 = gai_strerror(__ecode);
  std::operator<<(poVar2,pcVar1);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::str();
  std::runtime_error::runtime_error(this,local_250);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<::addrinfo, AddrInfoDeleter>
resolveAddress(const std::string& host, int port, int family, int type)
{
// On windows, getaddrinfo does not return an error for empty host
#ifdef WIN32
    if (host.empty()) {
        throw std::runtime_error("Error resolving address: ");
    }
#endif
    ::addrinfo hints;
    std::memset(&hints, 0, sizeof(hints));
    hints.ai_family = family;
    hints.ai_socktype = type;

    std::string service;
    if (port != 0) {
        service = std::to_string(port);
    }

    Socket::OSResource osResouce;

    auto* servInfoPtr = static_cast<::addrinfo*>(nullptr);
    const auto returnCode =
        getaddrinfo(host.c_str(), service.c_str(), &hints, &servInfoPtr);
    std::unique_ptr<::addrinfo, AddrInfoDeleter> servInfo(servInfoPtr);

    if (returnCode != 0) {
        std::ostringstream oss;
        oss << "Error resolving address: " << gai_strerror(returnCode);
        throw std::runtime_error(oss.str());
    }

    return servInfo;
}